

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,cmBuildOptions *buildOptions,bool verbose,string *presetName,
            bool listPresets)

{
  _Base_ptr __k;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  cmState *pcVar3;
  cmGlobalGenerator *pcVar4;
  bool bVar5;
  undefined8 nativeOptions_00;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  string *psVar10;
  iterator iVar11;
  iterator iVar12;
  cmValue cVar13;
  ostream *poVar14;
  undefined4 in_register_00000034;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *ostr_00;
  string cachePath;
  allocator<char> local_e8a;
  allocator<char> local_e89;
  string projName;
  ulong local_e68;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_e60;
  undefined1 local_e58 [40];
  string local_e30;
  string local_e10;
  stringstream ostr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_de0;
  undefined1 local_dd0 [24];
  _Alloc_hider _Stack_db8;
  pointer local_db0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_da8;
  size_type local_d98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d90;
  undefined1 local_d80 [32];
  __node_base local_d60;
  _Invoker_type local_d58;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  local_d50;
  _Rb_tree_node_base local_d18;
  pointer local_cf8;
  _Rb_tree_node_base local_ce8;
  __node_base local_cc8;
  _Rb_tree_node_base local_cb8;
  size_t local_c98;
  __node_base _Stack_c90;
  pointer local_c88;
  pointer pbStack_c80;
  pointer local_c78;
  pointer pbStack_c70;
  pointer local_c68;
  pointer pbStack_c60;
  _Base_ptr local_c58;
  _Base_ptr p_Stack_c50;
  _Base_ptr local_c48;
  pointer pbStack_c40;
  pointer local_c38;
  pointer pbStack_c30;
  _Base_ptr local_c28;
  _Base_ptr p_Stack_c20;
  _Alloc_hider local_c18;
  size_type local_c10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c08;
  pointer local_bf8;
  pointer pbStack_bf0;
  pointer local_be8;
  
  local_e68 = CONCAT44(in_register_00000034,jobs);
  local_e58._8_8_ = targets;
  local_e58._16_8_ = config;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ostr,"",(allocator<char> *)&cachePath);
  SetHomeDirectory(this,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ostr,"",(allocator<char> *)&cachePath);
  local_e58._24_8_ = nativeOptions;
  local_e58._32_8_ = dir;
  SetHomeOutputDirectory(this,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  if (presetName->_M_string_length != 0 || listPresets) {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeDirectory(this,(string *)&ostr);
    std::__cxx11::string::~string((string *)&ostr);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory(this,(string *)&ostr);
    std::__cxx11::string::~string((string *)&ostr);
    _ostr = (pointer)&local_de0;
    local_de0._M_local_buf[0] = '\0';
    aStack_da8._8_8_ = &local_d90;
    local_dd0._0_8_ = (pointer)0x0;
    local_dd0._8_8_ = (pointer)0x0;
    local_dd0._16_8_ = (pointer)0x0;
    _Stack_db8._M_p = (pointer)0x0;
    local_db0 = (pointer)0x0;
    aStack_da8._M_allocated_capacity = 0;
    local_d98 = 0;
    local_d90._M_local_buf[0] = '\0';
    p_Var1 = (_Base_ptr)(local_d80 + 8);
    local_d80._8_4_ = _S_red;
    local_d80._16_8_ = (_Base_ptr)0x0;
    local_d58 = (_Invoker_type)0x0;
    p_Var2 = &local_d50._M_impl.super__Rb_tree_header;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d18._M_left = &local_d18;
    local_d18._M_color = _S_red;
    local_d18._M_parent = (_Base_ptr)0x0;
    local_cf8 = (pointer)0x0;
    local_ce8._M_left = &local_ce8;
    local_ce8._M_color = _S_red;
    local_ce8._M_parent = (_Base_ptr)0x0;
    local_cc8._M_nxt = (_Hash_node_base *)0x0;
    local_cb8._M_left = &local_cb8;
    local_cb8._M_color = _S_red;
    local_cb8._M_parent = (_Base_ptr)0x0;
    local_c18._M_p = (pointer)&local_c08;
    local_c28 = (_Base_ptr)0x0;
    p_Stack_c20 = (_Base_ptr)0x0;
    local_c38 = (pointer)0x0;
    pbStack_c30 = (pointer)0x0;
    local_c48 = (_Base_ptr)0x0;
    pbStack_c40 = (pointer)0x0;
    local_c58 = (_Base_ptr)0x0;
    p_Stack_c50 = (_Base_ptr)0x0;
    local_c68 = (pointer)0x0;
    pbStack_c60 = (pointer)0x0;
    local_c78 = (pointer)0x0;
    pbStack_c70 = (pointer)0x0;
    local_c88 = (pointer)0x0;
    pbStack_c80 = (pointer)0x0;
    local_c98 = 0;
    _Stack_c90._M_nxt = (_Hash_node_base *)0x0;
    local_c10 = 0;
    local_c08._M_local_buf[0] = '\0';
    local_bf8 = (pointer)0x0;
    pbStack_bf0 = (pointer)0x0;
    local_be8 = (pointer)0x0;
    local_d80._24_8_ = p_Var1;
    local_d60._M_nxt = (_Hash_node_base *)p_Var1;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    local_d18._M_right = local_d18._M_left;
    local_ce8._M_right = local_ce8._M_left;
    local_cb8._M_right = local_cb8._M_left;
    psVar10 = GetHomeDirectory_abi_cxx11_(this);
    bVar7 = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)&ostr,psVar10,false);
    if (bVar7) {
      if (listPresets) {
        bVar7 = false;
        cmCMakePresetsGraph::PrintBuildPresetList
                  ((cmCMakePresetsGraph *)&ostr,(PrintPrecedingNewline *)0x0);
        iVar9 = 0;
      }
      else {
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                 ::find(&local_d50,presetName);
        uVar6 = local_e58._32_8_;
        if ((_Rb_tree_header *)iVar11._M_node == p_Var2) {
          psVar10 = GetHomeDirectory_abi_cxx11_(this);
          projName._M_dataplus._M_p._0_1_ = 0x22;
          cmStrCat<char_const(&)[25],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                    (&cachePath,(char (*) [25])"No such build preset in ",psVar10,
                     (char (*) [4])0x7d3226,presetName,(char *)&projName);
          cmSystemTools::Error(&cachePath);
LAB_00369437:
          std::__cxx11::string::~string((string *)&cachePath);
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&ostr,(PrintPrecedingNewline *)0x0);
        }
        else {
          if ((char)iVar11._M_node[4]._M_color == _S_black) {
            psVar10 = GetHomeDirectory_abi_cxx11_(this);
            projName._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                      (&cachePath,(char (*) [35])"Cannot use hidden build preset in ",psVar10,
                       (char (*) [4])0x7d3226,presetName,(char *)&projName);
            cmSystemTools::Error(&cachePath);
            goto LAB_00369437;
          }
          if (*(char *)&iVar11._M_node[0x18]._M_left == '\0') {
            cmStrCat<char_const(&)[34],std::__cxx11::string_const&,char_const(&)[27]>
                      (&cachePath,(char (*) [34])"Could not evaluate build preset \"",presetName,
                       (char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error(&cachePath);
          }
          else {
            if (*(char *)&iVar11._M_node[0x12]._M_parent != '\0') {
              __k = iVar11._M_node + 0x14;
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                               *)local_d80,__k);
              if (iVar12._M_node == p_Var1) {
                psVar10 = GetHomeDirectory_abi_cxx11_(this);
                projName._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                          (&cachePath,(char (*) [29])"No such configure preset in ",psVar10,
                           (char (*) [4])0x7d3226,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&projName);
                cmSystemTools::Error(&cachePath);
              }
              else {
                if ((char)iVar12._M_node[4]._M_color != _S_black) {
                  if (*(char *)&iVar12._M_node[0x25]._M_left == '\0') {
                    cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[27]>
                              (&cachePath,(char (*) [38])"Could not evaluate configure preset \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __k,(char (*) [27])"\": Invalid macro expansion");
                    cmSystemTools::Error(&cachePath);
                    std::__cxx11::string::~string((string *)&cachePath);
                    goto LAB_00369385;
                  }
                  if (iVar12._M_node[0x1f]._M_parent != (_Base_ptr)0x0) {
                    std::__cxx11::string::_M_assign((string *)uVar6);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator=(&(this->UnprocessedPresetEnvironment)._M_t,
                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&iVar11._M_node[0x12]._M_left);
                  ProcessPresetEnvironment(this);
                  if ((jobs + 1U < 2) && (*(char *)&iVar11._M_node[0x15]._M_parent == '\x01')) {
                    local_e68 = (ulong)*(uint *)&iVar11._M_node[0x15].field_0x4;
                  }
                  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       local_e58._8_8_ ==
                      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (local_e58._8_8_ + 8)) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_e58._8_8_,
                               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                 **)local_e58._8_8_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar11._M_node[0x15]._M_left,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar11._M_node[0x15]._M_right);
                  }
                  if (*(size_type *)(local_e58._16_8_ + 8) == 0) {
                    std::__cxx11::string::_M_assign((string *)local_e58._16_8_);
                  }
                  if ((buildOptions->Clean == false) &&
                     (*(char *)((long)&iVar11._M_node[0x17]._M_parent + 1) == '\x01')) {
                    buildOptions->Clean = *(bool *)&iVar11._M_node[0x17]._M_parent;
                  }
                  if ((buildOptions->ResolveMode == Default) &&
                     (*(char *)((long)&iVar11._M_node[0x18]._M_parent + 4) == '\x01')) {
                    buildOptions->ResolveMode =
                         *(PackageResolveMode *)&iVar11._M_node[0x18]._M_parent;
                  }
                  bVar7 = true;
                  bVar5 = !verbose;
                  verbose = (bool)1;
                  if (bVar5) {
                    if (*(char *)((long)&iVar11._M_node[0x17]._M_parent + 3) == '\x01') {
                      verbose = *(bool *)((long)&iVar11._M_node[0x17]._M_parent + 2);
                    }
                    else {
                      verbose = false;
                    }
                  }
                  iVar9 = 1;
                  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       local_e58._24_8_ ==
                      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (local_e58._24_8_ + 8)) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_e58._24_8_,
                               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                 **)local_e58._24_8_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar11._M_node[0x17]._M_left,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               iVar11._M_node[0x17]._M_right);
                  }
                  goto LAB_0036955a;
                }
                psVar10 = GetHomeDirectory_abi_cxx11_(this);
                projName._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                          (&cachePath,(char (*) [39])"Cannot use hidden configure preset in ",
                           psVar10,(char (*) [4])0x7d3226,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&projName);
                cmSystemTools::Error(&cachePath);
              }
              std::__cxx11::string::~string((string *)&cachePath);
              PrintPresetList(this,(cmCMakePresetsGraph *)&ostr);
              goto LAB_00369385;
            }
            psVar10 = GetHomeDirectory_abi_cxx11_(this);
            projName._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char_const(&)[37],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                      (&cachePath,(char (*) [37])"Cannot use disabled build preset in ",psVar10,
                       (char (*) [4])0x7d3226,presetName,(char *)&projName);
            cmSystemTools::Error(&cachePath);
          }
          std::__cxx11::string::~string((string *)&cachePath);
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&ostr,(PrintPrecedingNewline *)0x0);
        }
        bVar7 = false;
        iVar9 = 1;
      }
    }
    else {
      psVar10 = GetHomeDirectory_abi_cxx11_(this);
      cmJSONState::GetErrorMessage_abi_cxx11_(&projName,(cmJSONState *)local_dd0,true);
      cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                (&cachePath,(char (*) [29])"Could not read presets from ",psVar10,
                 (char (*) [2])0x7c9504,&projName);
      cmSystemTools::Error(&cachePath);
      std::__cxx11::string::~string((string *)&cachePath);
      std::__cxx11::string::~string((string *)&projName);
LAB_00369385:
      iVar9 = 1;
      bVar7 = false;
    }
LAB_0036955a:
    cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)&ostr);
    if (!bVar7) {
      return iVar9;
    }
  }
  uVar6 = local_e58._32_8_;
  bVar7 = cmsys::SystemTools::FileIsDirectory((string *)local_e58._32_8_);
  if (!bVar7) {
    poVar14 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar14 = std::operator<<(poVar14,(string *)uVar6);
    std::operator<<(poVar14," is not a directory\n");
    return 1;
  }
  FindCacheFile(&cachePath,(string *)uVar6);
  bVar7 = LoadCache(this,&cachePath);
  nativeOptions_00 = local_e58._24_8_;
  if (bVar7) {
    pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ostr,"CMAKE_GENERATOR",(allocator<char> *)&projName);
    cVar13 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
    std::__cxx11::string::~string((string *)&ostr);
    if (cVar13.Value != (string *)0x0) {
      iVar9 = 1;
      CreateGlobalGenerator((cmake *)local_e58,(string *)this,SUB81(cVar13.Value,0));
      if ((cmGlobalGenerator *)local_e58._0_8_ == (cmGlobalGenerator *)0x0) {
        poVar14 = std::operator<<((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \""
                                 );
        poVar14 = std::operator<<(poVar14,(string *)cVar13.Value);
        std::operator<<(poVar14,"\"\n");
      }
      else {
        local_e60._M_head_impl = (cmGlobalGenerator *)local_e58._0_8_;
        local_e58._0_8_ = (cmGlobalGenerator *)0x0;
        SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                 *)&local_e60);
        if (local_e60._M_head_impl != (cmGlobalGenerator *)0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)&(local_e60._M_head_impl)->_vptr_cmGlobalGenerator)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
        local_e60._M_head_impl = (cmGlobalGenerator *)0x0;
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ostr,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)&projName);
        cVar13 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
        std::__cxx11::string::~string((string *)&ostr);
        if (cVar13.Value != (string *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile
                    ((cmMakefile *)&ostr,
                     (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                     (cmStateSnapshot *)&projName);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar8 = (*pcVar4->_vptr_cmGlobalGenerator[8])(pcVar4,cVar13.Value,&ostr);
          cmMakefile::~cmMakefile((cmMakefile *)&ostr);
          if ((char)iVar8 == '\0') goto LAB_00369ac5;
        }
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ostr,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&projName);
        cVar13 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
        std::__cxx11::string::~string((string *)&ostr);
        if (cVar13.Value != (string *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile
                    ((cmMakefile *)&ostr,
                     (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                     (cmStateSnapshot *)&projName);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar8 = (*pcVar4->_vptr_cmGlobalGenerator[9])(pcVar4,cVar13.Value,&ostr);
          cmMakefile::~cmMakefile((cmMakefile *)&ostr);
          if ((char)iVar8 == '\0') goto LAB_00369ac5;
        }
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ostr,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)&projName);
        cVar13 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
        std::__cxx11::string::~string((string *)&ostr);
        if (cVar13.Value != (string *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile
                    ((cmMakefile *)&ostr,
                     (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                     (cmStateSnapshot *)&projName);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar9 = 1;
          iVar8 = (*pcVar4->_vptr_cmGlobalGenerator[10])(pcVar4,cVar13.Value,1,&ostr);
          cmMakefile::~cmMakefile((cmMakefile *)&ostr);
          if ((char)iVar8 == '\0') goto LAB_00369ac5;
        }
        projName._M_dataplus._M_p = (pointer)&projName.field_2;
        projName._M_string_length = 0;
        projName.field_2._M_allocated_capacity =
             projName.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ostr,"CMAKE_PROJECT_NAME",(allocator<char> *)(local_e58 + 0x28));
        cVar13 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
        std::__cxx11::string::~string((string *)&ostr);
        if (cVar13.Value == (string *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
LAB_003699fd:
          iVar9 = 1;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&projName);
          pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ostr,"CMAKE_VERBOSE_MAKEFILE",(allocator<char> *)&local_e10);
          local_e30._M_dataplus._M_p = (pointer)cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
          bVar7 = cmValue::IsOn((cmValue *)(local_e58 + 0x28));
          std::__cxx11::string::~string((string *)&ostr);
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          iVar9 = (*pcVar4->_vptr_cmGlobalGenerator[0xb])
                            (pcVar4,(this->State)._M_t.
                                    super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>
                                    .super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
          if ((char)iVar9 == '\0') goto LAB_003699fd;
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          (*pcVar4->_vptr_cmGlobalGenerator[0x16])(pcVar4,&std::cerr,local_e68);
          std::__cxx11::stringstream::stringstream((stringstream *)&ostr);
          if (bVar7 || (verbose & 1U) != 0) {
            ostr_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&std::cout;
          }
          else {
            ostr_00 = &local_de0;
          }
          pcVar4 = (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_e58 + 0x28),"",&local_e89);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e10,"",&local_e8a);
          iVar9 = cmGlobalGenerator::Build
                            (pcVar4,(int)local_e68,(string *)(local_e58 + 0x28),(string *)uVar6,
                             &projName,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_e58._8_8_,(ostream *)ostr_00,&local_e10,
                             (string *)local_e58._16_8_,buildOptions,(bool)(bVar7 | verbose & 1U),
                             (cmDuration)0x0,OUTPUT_PASSTHROUGH,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)nativeOptions_00);
          std::__cxx11::string::~string((string *)&local_e10);
          std::__cxx11::string::~string((string *)(local_e58 + 0x28));
          std::__cxx11::stringstream::~stringstream((stringstream *)&ostr);
        }
        std::__cxx11::string::~string((string *)&projName);
      }
LAB_00369ac5:
      if ((cmGlobalGenerator *)local_e58._0_8_ != (cmGlobalGenerator *)0x0) {
        (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                     *)local_e58._0_8_)->
                  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                  _vptr_cmGlobalGeneratorFactory)();
      }
      goto LAB_00369ad5;
    }
    std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
  }
  iVar9 = 1;
LAB_00369ad5:
  std::__cxx11::string::~string((string *)&cachePath);
  return iVar9;
}

Assistant:

int cmake::Build(int jobs, std::string dir, std::vector<std::string> targets,
                 std::string config, std::vector<std::string> nativeOptions,
                 cmBuildOptions& buildOptions, bool verbose,
                 const std::string& presetName, bool listPresets)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");

#if !defined(CMAKE_BOOTSTRAP)
  if (!presetName.empty() || listPresets) {
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

    cmCMakePresetsGraph settingsFile;
    auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
    if (result != true) {
      cmSystemTools::Error(
        cmStrCat("Could not read presets from ", this->GetHomeDirectory(), ":",
                 settingsFile.parseState.GetErrorMessage()));
      return 1;
    }

    if (listPresets) {
      settingsFile.PrintBuildPresetList();
      return 0;
    }

    auto presetPair = settingsFile.BuildPresets.find(presetName);
    if (presetPair == settingsFile.BuildPresets.end()) {
      cmSystemTools::Error(cmStrCat("No such build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (presetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto const& expandedPreset = presetPair->second.Expanded;
    if (!expandedPreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate build preset \"",
                                    presetName,
                                    "\": Invalid macro expansion"));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (!expandedPreset->ConditionResult) {
      cmSystemTools::Error(cmStrCat("Cannot use disabled build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto configurePresetPair =
      settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
    if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
      cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    if (configurePresetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
    if (!expandedConfigurePreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                    expandedPreset->ConfigurePreset,
                                    "\": Invalid macro expansion"));
      return 1;
    }

    if (!expandedConfigurePreset->BinaryDir.empty()) {
      dir = expandedConfigurePreset->BinaryDir;
    }

    this->UnprocessedPresetEnvironment = expandedPreset->Environment;
    this->ProcessPresetEnvironment();

    if ((jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL ||
         jobs == cmake::NO_BUILD_PARALLEL_LEVEL) &&
        expandedPreset->Jobs) {
      jobs = *expandedPreset->Jobs;
    }

    if (targets.empty()) {
      targets.insert(targets.begin(), expandedPreset->Targets.begin(),
                     expandedPreset->Targets.end());
    }

    if (config.empty()) {
      config = expandedPreset->Configuration;
    }

    if (!buildOptions.Clean && expandedPreset->CleanFirst) {
      buildOptions.Clean = *expandedPreset->CleanFirst;
    }

    if (buildOptions.ResolveMode == PackageResolveMode::Default &&
        expandedPreset->ResolvePackageReferences) {
      buildOptions.ResolveMode = *expandedPreset->ResolvePackageReferences;
    }

    if (!verbose && expandedPreset->Verbose) {
      verbose = *expandedPreset->Verbose;
    }

    if (nativeOptions.empty()) {
      nativeOptions.insert(nativeOptions.begin(),
                           expandedPreset->NativeToolOptions.begin(),
                           expandedPreset->NativeToolOptions.end());
    }
  }
#endif

  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  cmValue cachedGenerator = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  auto gen = this->CreateGlobalGenerator(*cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \""
              << *cachedGenerator << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(std::move(gen));
  cmValue cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorInstance(*cachedGeneratorInstance,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorPlatform(*cachedGeneratorPlatform,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorToolset =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_TOOLSET");
  if (cachedGeneratorToolset) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorToolset(*cachedGeneratorToolset,
                                                    true, &mf)) {
      return 1;
    }
  }
  std::string projName;
  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = *cachedProjectName;

  if (this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE").IsOn()) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = cmStrCat("Build files have been written to: ",
                                     this->GetHomeOutputDirectory());
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  if (!this->GlobalGenerator->ReadCacheEntriesForBuild(*this->State)) {
    return 1;
  }

  this->GlobalGenerator->PrintBuildCommandAdvice(std::cerr, jobs);
  std::stringstream ostr;
  // `cmGlobalGenerator::Build` logs metadata about what directory and commands
  // are being executed to the `output` parameter. If CMake is verbose, print
  // this out.
  std::ostream& verbose_ostr = verbose ? std::cout : ostr;
  int buildresult = this->GlobalGenerator->Build(
    jobs, "", dir, projName, targets, verbose_ostr, "", config, buildOptions,
    verbose, cmDuration::zero(), cmSystemTools::OUTPUT_PASSTHROUGH,
    nativeOptions);

  return buildresult;
}